

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeEntryPointData.cpp
# Opt level: O0

void __thiscall NativeEntryPointData::CleanupXDataInfo(NativeEntryPointData *this)

{
  XDataAllocation **ppXVar1;
  nullptr_t local_18;
  NativeEntryPointData *local_10;
  NativeEntryPointData *this_local;
  
  local_10 = this;
  ppXVar1 = Memory::WriteBarrierPtr::operator_cast_to_XDataAllocation__
                      ((WriteBarrierPtr *)&this->xdataInfo);
  if (*ppXVar1 != (XDataAllocation *)0x0) {
    ppXVar1 = Memory::WriteBarrierPtr::operator_cast_to_XDataAllocation__
                        ((WriteBarrierPtr *)&this->xdataInfo);
    Memory::XDataAllocator::Unregister(*ppXVar1);
    local_18 = (nullptr_t)0x0;
    Memory::WriteBarrierPtr<Memory::XDataAllocation>::operator=(&this->xdataInfo,&local_18);
  }
  return;
}

Assistant:

void
NativeEntryPointData::CleanupXDataInfo()
{
    if (this->xdataInfo != nullptr)
    {
        XDataAllocator::Unregister(this->xdataInfo);
#ifdef _WIN32
        if (AutoSystemInfo::Data.IsWin8OrLater())
        {
            // transfers ownership of xdataInfo object
            if(!DelayDeletingFunctionTable::AddEntry(this->xdataInfo))
            {
                DelayDeletingFunctionTable::DeleteFunctionTable(this->xdataInfo);
            }
        }
        else
        {
            HeapDelete(this->xdataInfo);
        }
#endif
        this->xdataInfo = nullptr;
    }
}